

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall xatlas::internal::Mesh::createColocals(Mesh *this)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Vector3 *pVVar5;
  AABB *pAVar6;
  uint *puVar7;
  Vector3 *v1;
  uint32_t local_ec;
  uint32_t local_e8;
  uint32_t j_1;
  uint32_t otherVertex;
  uint32_t j;
  uint local_c8;
  uint32_t local_c4;
  uint32_t i_2;
  uint32_t i_1;
  Array<unsigned_int> potential;
  Array<unsigned_int> colocals;
  BVH bvh;
  undefined8 local_50;
  undefined8 local_48;
  uint32_t local_40;
  uint32_t i;
  undefined1 local_30 [8];
  Array<xatlas::internal::AABB> aabbs;
  uint32_t vertexCount;
  Mesh *this_local;
  
  aabbs.m_base._20_4_ = Array<xatlas::internal::Vector3>::size(&this->m_positions);
  Array<xatlas::internal::AABB>::Array((Array<xatlas::internal::AABB> *)local_30,2);
  Array<xatlas::internal::AABB>::resize
            ((Array<xatlas::internal::AABB> *)local_30,aabbs.m_base._20_4_);
  for (local_40 = 0; uVar3 = Array<xatlas::internal::Vector3>::size(&this->m_positions),
      local_40 < uVar3; local_40 = local_40 + 1) {
    pVVar5 = Array<xatlas::internal::Vector3>::operator[](&this->m_positions,local_40);
    AABB::AABB((AABB *)&bvh.m_nodes.m_base.capacity,pVVar5,this->m_epsilon);
    pAVar6 = Array<xatlas::internal::AABB>::operator[]
                       ((Array<xatlas::internal::AABB> *)local_30,local_40);
    (pAVar6->min).x = (float)bvh.m_nodes.m_base.capacity;
    (pAVar6->min).y = (float)bvh.m_nodes.m_base._20_4_;
    *(undefined8 *)&(pAVar6->min).z = local_50;
    (pAVar6->max).y = (float)(undefined4)local_48;
    (pAVar6->max).z = (float)local_48._4_4_;
  }
  BVH::BVH((BVH *)&colocals.m_base.capacity,(Array<xatlas::internal::AABB> *)local_30,4);
  Array<unsigned_int>::Array((Array<unsigned_int> *)&potential.m_base.capacity,7);
  Array<unsigned_int>::Array((Array<unsigned_int> *)&i_2,7);
  this->m_colocalVertexCount = 0;
  Array<unsigned_int>::resize(&this->m_nextColocalVertex,aabbs.m_base._20_4_);
  for (local_c4 = 0; local_c4 < (uint)aabbs.m_base._20_4_; local_c4 = local_c4 + 1) {
    puVar7 = Array<unsigned_int>::operator[](&this->m_nextColocalVertex,local_c4);
    *puVar7 = 0xffffffff;
  }
  local_c8 = 0;
  do {
    if ((uint)aabbs.m_base._20_4_ <= local_c8) {
      Array<unsigned_int>::~Array((Array<unsigned_int> *)&i_2);
      Array<unsigned_int>::~Array((Array<unsigned_int> *)&potential.m_base.capacity);
      BVH::~BVH((BVH *)&colocals.m_base.capacity);
      Array<xatlas::internal::AABB>::~Array((Array<xatlas::internal::AABB> *)local_30);
      return;
    }
    puVar7 = Array<unsigned_int>::operator[](&this->m_nextColocalVertex,local_c8);
    if (*puVar7 == 0xffffffff) {
      Array<unsigned_int>::clear((Array<unsigned_int> *)&potential.m_base.capacity);
      Array<unsigned_int>::push_back((Array<unsigned_int> *)&potential.m_base.capacity,&local_c8);
      pVVar5 = Array<xatlas::internal::Vector3>::operator[](&this->m_positions,local_c8);
      AABB::AABB((AABB *)&otherVertex,pVVar5,this->m_epsilon);
      BVH::query((BVH *)&colocals.m_base.capacity,(AABB *)&otherVertex,(Array<unsigned_int> *)&i_2);
      for (j_1 = 0; uVar3 = j_1, uVar4 = Array<unsigned_int>::size((Array<unsigned_int> *)&i_2),
          uVar3 < uVar4; j_1 = j_1 + 1) {
        puVar7 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)&i_2,j_1);
        local_e8 = *puVar7;
        if (local_e8 != local_c8) {
          pVVar5 = Array<xatlas::internal::Vector3>::operator[](&this->m_positions,local_c8);
          v1 = Array<xatlas::internal::Vector3>::operator[](&this->m_positions,local_e8);
          bVar2 = equal(pVVar5,v1,this->m_epsilon);
          if ((bVar2) &&
             (puVar7 = Array<unsigned_int>::operator[](&this->m_nextColocalVertex,local_e8),
             *puVar7 == 0xffffffff)) {
            Array<unsigned_int>::push_back
                      ((Array<unsigned_int> *)&potential.m_base.capacity,&local_e8);
          }
        }
      }
      uVar3 = Array<unsigned_int>::size((Array<unsigned_int> *)&potential.m_base.capacity);
      uVar1 = local_c8;
      if (uVar3 == 1) {
        puVar7 = Array<unsigned_int>::operator[](&this->m_nextColocalVertex,local_c8);
        *puVar7 = uVar1;
      }
      else {
        uVar3 = Array<unsigned_int>::size((Array<unsigned_int> *)&potential.m_base.capacity);
        this->m_colocalVertexCount = this->m_colocalVertexCount + uVar3;
        puVar7 = Array<unsigned_int>::data((Array<unsigned_int> *)&potential.m_base.capacity);
        uVar3 = Array<unsigned_int>::size((Array<unsigned_int> *)&potential.m_base.capacity);
        insertionSort<unsigned_int>(puVar7,uVar3);
        for (local_ec = 0;
            uVar3 = Array<unsigned_int>::size((Array<unsigned_int> *)&potential.m_base.capacity),
            local_ec < uVar3; local_ec = local_ec + 1) {
          uVar3 = Array<unsigned_int>::size((Array<unsigned_int> *)&potential.m_base.capacity);
          puVar7 = Array<unsigned_int>::operator[]
                             ((Array<unsigned_int> *)&potential.m_base.capacity,
                              (local_ec + 1) % uVar3);
          uVar1 = *puVar7;
          puVar7 = Array<unsigned_int>::operator[]
                             ((Array<unsigned_int> *)&potential.m_base.capacity,local_ec);
          puVar7 = Array<unsigned_int>::operator[](&this->m_nextColocalVertex,*puVar7);
          *puVar7 = uVar1;
        }
        puVar7 = Array<unsigned_int>::operator[](&this->m_nextColocalVertex,local_c8);
        if (*puVar7 == 0xffffffff) {
          __assert_fail("m_nextColocalVertex[i] != (4294967295U)",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x9d8,"void xatlas::internal::Mesh::createColocals()");
        }
      }
    }
    local_c8 = local_c8 + 1;
  } while( true );
}

Assistant:

void createColocals()
	{
		const uint32_t vertexCount = m_positions.size();
		Array<AABB> aabbs(MemTag::BVH);
		aabbs.resize(vertexCount);
		for (uint32_t i = 0; i < m_positions.size(); i++)
			aabbs[i] = AABB(m_positions[i], m_epsilon);
		BVH bvh(aabbs);
		Array<uint32_t> colocals(MemTag::MeshColocals);
		Array<uint32_t> potential(MemTag::MeshColocals);
		m_colocalVertexCount = 0;
		m_nextColocalVertex.resize(vertexCount);
		for (uint32_t i = 0; i < vertexCount; i++)
			m_nextColocalVertex[i] = UINT32_MAX;
		for (uint32_t i = 0; i < vertexCount; i++) {
			if (m_nextColocalVertex[i] != UINT32_MAX)
				continue; // Already linked.
			// Find other vertices colocal to this one.
			colocals.clear();
			colocals.push_back(i); // Always add this vertex.
			bvh.query(AABB(m_positions[i], m_epsilon), potential);
			for (uint32_t j = 0; j < potential.size(); j++) {
				const uint32_t otherVertex = potential[j];
				if (otherVertex != i && equal(m_positions[i], m_positions[otherVertex], m_epsilon) && m_nextColocalVertex[otherVertex] == UINT32_MAX)
					colocals.push_back(otherVertex);
			}
			if (colocals.size() == 1) {
				// No colocals for this vertex.
				m_nextColocalVertex[i] = i;
				continue; 
			}
			m_colocalVertexCount += colocals.size();
			// Link in ascending order.
			insertionSort(colocals.data(), colocals.size());
			for (uint32_t j = 0; j < colocals.size(); j++)
				m_nextColocalVertex[colocals[j]] = colocals[(j + 1) % colocals.size()];
			XA_DEBUG_ASSERT(m_nextColocalVertex[i] != UINT32_MAX);
		}
	}